

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O0

void recall_tree_ns::add_node_id_feature(recall_tree *b,uint32_t cn,example *ec)

{
  uint32_t uVar1;
  uint64_t uVar2;
  v_array<unsigned_char> *this;
  node *pnVar3;
  uint in_ESI;
  undefined8 *in_RDI;
  features *fs;
  size_t ss;
  uint64_t mask;
  vw *all;
  parameters *in_stack_ffffffffffffffc8;
  features *this_00;
  uint local_c;
  
  this_00 = (features *)*in_RDI;
  uVar2 = parameters::mask(in_stack_ffffffffffffffc8);
  uVar1 = parameters::stride_shift(in_stack_ffffffffffffffc8);
  this = (v_array<unsigned_char> *)(ulong)uVar1;
  v_array<unsigned_char>::push_back(this,&in_stack_ffffffffffffffc8->sparse);
  local_c = in_ESI;
  if ((*(byte *)((long)in_RDI + 0xc) & 1) == 0) {
    while (local_c != 0) {
      features::push_back(this_00,(feature_value)(uVar2 >> 0x20),(feature_index)this);
      pnVar3 = v_array<recall_tree_ns::node>::operator[]
                         ((v_array<recall_tree_ns::node> *)(in_RDI + 2),(ulong)local_c);
      local_c = pnVar3->parent;
    }
  }
  else {
    features::push_back(this_00,(feature_value)(uVar2 >> 0x20),(feature_index)this);
  }
  return;
}

Assistant:

void add_node_id_feature(recall_tree& b, uint32_t cn, example& ec)
{
  vw* all = b.all;
  uint64_t mask = all->weights.mask();
  size_t ss = all->weights.stride_shift();

  ec.indices.push_back(node_id_namespace);
  features& fs = ec.feature_space[node_id_namespace];

  if (b.node_only)
  {
    fs.push_back(1., (((uint64_t)868771 * cn) << ss) & mask);
  }
  else
  {
    while (cn > 0)
    {
      fs.push_back(1., (((uint64_t)868771 * cn) << ss) & mask);
      cn = b.nodes[cn].parent;
    }
  }

  // TODO: audit ?
  // TODO: if namespace already exists ?
}